

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemberSymbols.cpp
# Opt level: O1

span<const_slang::ast::Expression_*const,_18446744073709551615UL> __thiscall
slang::ast::NetAliasSymbol::getNetReferences(NetAliasSymbol *this)

{
  Scope *pSVar1;
  SyntaxNode *pSVar2;
  Type *this_00;
  Compilation *pCVar3;
  size_type sVar4;
  DriverBitRange secondRange;
  NetAliasSymbol *pNVar5;
  SourceLocation SVar6;
  bool bVar7;
  int iVar8;
  bitwidth_t bVar9;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> *ppSVar10;
  undefined4 extraout_var;
  Diagnostic *this_02;
  undefined4 extraout_var_00;
  undefined8 *puVar11;
  SourceLocation SVar12;
  EVP_PKEY_CTX *extraout_RDX;
  EVP_PKEY_CTX *extraout_RDX_00;
  EVP_PKEY_CTX *extraout_RDX_01;
  EVP_PKEY_CTX *src;
  size_t extraout_RDX_02;
  SourceLocation SVar13;
  ulong uVar14;
  Compilation *pCVar15;
  __extent_storage<18446744073709551615UL> _Var16;
  Expression *pEVar17;
  Compilation *dst;
  NetAliasSymbol *pNVar18;
  long lVar19;
  NetAliasSymbol *pNVar20;
  long lVar21;
  undefined8 *puVar22;
  pointer ppEVar23;
  Expression *pEVar24;
  SourceLocation SVar25;
  DriverBitRange firstRange;
  LookupLocation LVar26;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> sVar27;
  SmallVector<const_slang::ast::Expression_*,_5UL> buffer;
  NetAliasVisitor visitor;
  ASTContext context;
  SmallVector<slang::SmallVector<slang::ast::NetAlias,_2UL>,_2UL> netAliases;
  EvalContext evalCtx;
  uint local_5a4;
  Expression *local_5a0;
  Scope *local_598;
  NetAliasSymbol *local_590;
  ulong local_588;
  ulong local_580;
  ulong local_578;
  long local_570;
  ulong local_568;
  Compilation *local_560;
  undefined8 *local_558;
  unsigned_long local_550;
  NetAliasSymbol *pNStack_548;
  SmallVectorBase<const_slang::ast::Expression_*> local_540 [2];
  NetAliasVisitor local_500;
  ASTContext local_488;
  SmallVectorBase<slang::SmallVector<slang::ast::NetAlias,_2UL>_> local_450;
  EvalContext local_388;
  Expression *this_01;
  
  if ((this->netRefs).
      super__Optional_base<std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>,_true,_true>
      ._M_payload.
      super__Optional_payload_base<std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
      ._M_engaged == true) {
    ppEVar23 = (this->netRefs).
               super__Optional_base<std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>,_true,_true>
               ._M_payload.
               super__Optional_payload_base<std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
               ._M_payload._M_value._M_ptr;
    _Var16._M_extent_value =
         (this->netRefs).
         super__Optional_base<std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>,_true,_true>
         ._M_payload.
         super__Optional_payload_base<std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
         ._M_payload._M_value._M_extent._M_extent_value;
  }
  else {
    pSVar1 = (this->super_Symbol).parentScope;
    pSVar2 = (this->super_Symbol).originatingSyntax;
    local_540[0].data_ = (pointer)local_540[0].firstElement;
    local_540[0].len = 0;
    local_540[0].cap = 5;
    LVar26 = LookupLocation::after(&this->super_Symbol);
    local_500.context = &local_488;
    local_488.lookupIndex = LVar26.index;
    local_488.flags.m_bits = 0x100000020;
    local_488.randomizeDetails = (RandomizeDetails *)0x0;
    local_488.assertionInstance = (AssertionInstanceDetails *)0x0;
    local_488.instanceOrProc = (Symbol *)0x0;
    local_488.firstTempVar = (TempVarSymbol *)0x0;
    local_388.stack.super_SmallVectorBase<slang::ast::EvalContext::Frame>.data_ =
         (pointer)local_388.stack.super_SmallVectorBase<slang::ast::EvalContext::Frame>.firstElement
    ;
    local_388.astCtx.assertionInstance = (AssertionInstanceDetails *)0x0;
    local_388.astCtx.firstTempVar = (TempVarSymbol *)0x0;
    local_388.astCtx.randomizeDetails = (RandomizeDetails *)0x0;
    local_388.astCtx.flags.m_bits = 0x100000020;
    local_388.astCtx.instanceOrProc = (Symbol *)0x0;
    local_388.astCtx._12_4_ = local_488._12_4_;
    pEVar24 = (Expression *)0x0;
    local_388.flags.m_bits = '\0';
    local_388._60_8_ = 0;
    local_388._68_8_ = 0;
    local_388.queueTarget._4_4_ = 0;
    local_388.stack.super_SmallVectorBase<slang::ast::EvalContext::Frame>.len = 0;
    SVar12 = (SourceLocation)0x2;
    local_388.stack.super_SmallVectorBase<slang::ast::EvalContext::Frame>.cap = 2;
    local_388.lvalStack.super_SmallVectorBase<slang::ast::LValue_*>.data_ =
         (pointer)local_388.lvalStack.super_SmallVectorBase<slang::ast::LValue_*>.firstElement;
    local_388.lvalStack.super_SmallVectorBase<slang::ast::LValue_*>.len = 0;
    local_388.lvalStack.super_SmallVectorBase<slang::ast::LValue_*>.cap = 5;
    local_388.diags.super_SmallVector<slang::Diagnostic,_2UL>.
    super_SmallVectorBase<slang::Diagnostic>.data_ =
         (pointer)local_388.diags.super_SmallVector<slang::Diagnostic,_2UL>.
                  super_SmallVectorBase<slang::Diagnostic>.firstElement;
    local_388.diags.super_SmallVector<slang::Diagnostic,_2UL>.
    super_SmallVectorBase<slang::Diagnostic>.len = 0;
    local_388.diags.super_SmallVector<slang::Diagnostic,_2UL>.
    super_SmallVectorBase<slang::Diagnostic>.cap = 2;
    local_388.warnings.super_SmallVector<slang::Diagnostic,_2UL>.
    super_SmallVectorBase<slang::Diagnostic>.data_ =
         (pointer)local_388.warnings.super_SmallVector<slang::Diagnostic,_2UL>.
                  super_SmallVectorBase<slang::Diagnostic>.firstElement;
    local_388.warnings.super_SmallVector<slang::Diagnostic,_2UL>.
    super_SmallVectorBase<slang::Diagnostic>.len = 0;
    local_388.warnings.super_SmallVector<slang::Diagnostic,_2UL>.
    super_SmallVectorBase<slang::Diagnostic>.cap = 2;
    local_388.backtraceReported = false;
    local_388.disableRange.startLoc = (SourceLocation)0x0;
    local_388.disableRange.endLoc = (SourceLocation)0x0;
    src = (EVP_PKEY_CTX *)
          local_500.netAliases.super_SmallVectorBase<slang::ast::NetAlias>.firstElement;
    local_500.commonNetType = (NetType *)0x0;
    local_500.netAliases.super_SmallVectorBase<slang::ast::NetAlias>.len = 0;
    local_500.netAliases.super_SmallVectorBase<slang::ast::NetAlias>.cap = 2;
    local_500.evalCtx = &local_388;
    local_500.issuedError = false;
    local_450.data_ = (pointer)local_450.firstElement;
    local_450.len = 0;
    local_450.cap = 2;
    uVar14 = *(long *)(pSVar2 + 6) + 1;
    pEVar17 = pEVar24;
    local_598 = pSVar1;
    local_590 = this;
    local_500.netAliases.super_SmallVectorBase<slang::ast::NetAlias>.data_ = (pointer)src;
    local_488.scope.ptr = pSVar1;
    local_388.astCtx.scope.ptr = pSVar1;
    local_388.astCtx.lookupIndex = local_488.lookupIndex;
    if (1 < uVar14) {
      uVar14 = uVar14 >> 1;
      lVar21 = 0;
      pEVar17 = (Expression *)0x0;
      do {
        ppSVar10 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                             ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                              ((long)&(pSVar2[5].previewNode)->kind + lVar21));
        iVar8 = Expression::bind((int)*ppSVar10,(sockaddr *)&local_488,0);
        this_01 = (Expression *)CONCAT44(extraout_var,iVar8);
        SVar12 = (SourceLocation)0x0;
        bVar7 = Expression::requireLValue
                          (this_01,&local_488,(SourceLocation)0x0,
                           (bitmask<slang::ast::AssignFlags>)0x0,(Expression *)0x0);
        src = extraout_RDX;
        if (bVar7) {
          this_00 = (this_01->type).ptr;
          if ((bitwidth_t)pEVar24 == 0) {
            bVar9 = Type::getBitWidth(this_00);
            pEVar24 = (Expression *)(ulong)bVar9;
          }
          else {
            bVar9 = Type::getBitWidth(this_00);
            if (((bitwidth_t)pEVar24 != bVar9) && (pEVar17 == (Expression *)0x0)) {
              SVar12 = (this_01->sourceRange).endLoc;
              this_02 = ASTContext::addDiag(&local_488,(DiagCode)0x890006,this_01->sourceRange);
              bVar9 = Type::getBitWidth((this_01->type).ptr);
              local_5a0 = (Expression *)(ulong)bVar9;
              std::
              vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
              ::emplace_back<unsigned_long>(&this_02->args,(unsigned_long *)&local_5a0);
              local_5a0 = pEVar24;
              std::
              vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
              ::emplace_back<unsigned_long>(&this_02->args,(unsigned_long *)&local_5a0);
              pEVar17 = (Expression *)0x1;
            }
          }
          Expression::visitExpression<slang::ast::Expression_const,slang::ast::NetAliasVisitor&>
                    (this_01,this_01,&local_500);
          local_5a0 = this_01;
          SmallVectorBase<slang::ast::Expression_const*>::
          emplace_back<slang::ast::Expression_const*>
                    ((SmallVectorBase<slang::ast::Expression_const*> *)local_540,&local_5a0);
          src = extraout_RDX_00;
          if (local_500.netAliases.super_SmallVectorBase<slang::ast::NetAlias>.len != 0) {
            SmallVectorBase<slang::SmallVector<slang::ast::NetAlias,2ul>>::
            emplace_back<slang::SmallVector<slang::ast::NetAlias,2ul>>
                      ((SmallVectorBase<slang::SmallVector<slang::ast::NetAlias,2ul>> *)&local_450,
                       &local_500.netAliases);
            local_500.netAliases.super_SmallVectorBase<slang::ast::NetAlias>.len = 0;
            src = extraout_RDX_01;
          }
        }
        lVar21 = lVar21 + 0x30;
        uVar14 = uVar14 - 1;
      } while (uVar14 != 0);
    }
    pNVar20 = local_590;
    dst = local_598->compilation;
    iVar8 = SmallVectorBase<const_slang::ast::Expression_*>::copy(local_540,(EVP_PKEY_CTX *)dst,src)
    ;
    (pNVar20->netRefs).
    super__Optional_base<std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>,_true,_true>
    ._M_payload.
    super__Optional_payload_base<std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
    ._M_payload._M_value._M_ptr = (pointer)CONCAT44(extraout_var_00,iVar8);
    (pNVar20->netRefs).
    super__Optional_base<std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>,_true,_true>
    ._M_payload.
    super__Optional_payload_base<std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
    ._M_payload._M_value._M_extent._M_extent_value = extraout_RDX_02;
    if ((pNVar20->netRefs).
        super__Optional_base<std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>,_true,_true>
        ._M_payload.
        super__Optional_payload_base<std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
        ._M_engaged == false) {
      (pNVar20->netRefs).
      super__Optional_base<std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>,_true,_true>
      ._M_payload.
      super__Optional_payload_base<std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
      ._M_engaged = true;
    }
    if (((pEVar17 == (Expression *)0x0) && (local_588 = local_450.len, local_450.len != 0)) &&
       (local_580 = local_450.len - 1, local_580 != 0)) {
      local_560 = local_598->compilation;
      local_578 = 0;
      local_5a4 = SVar12._0_4_;
      do {
        local_570 = local_578 * 0x58;
        uVar14 = local_578 + 1;
        local_578 = uVar14;
        do {
          puVar11 = *(undefined8 **)
                     (((local_450.data_)->super_SmallVectorBase<slang::ast::NetAlias>).firstElement
                     + local_570 + -0x18);
          local_558 = puVar11 + *(long *)(((local_450.data_)->
                                          super_SmallVectorBase<slang::ast::NetAlias>).firstElement
                                         + local_570 + -0x10) * 4;
          pCVar3 = (Compilation *)
                   local_450.data_[uVar14].super_SmallVectorBase<slang::ast::NetAlias>.data_;
          sVar4 = local_450.data_[uVar14].super_SmallVectorBase<slang::ast::NetAlias>.len;
          bVar7 = false;
          dst = pCVar3;
          local_568 = uVar14;
          while ((puVar11 != local_558 &&
                 (dst != (Compilation *)(&pCVar3->super_BumpAllocator + sVar4 * 2)))) {
            SVar13 = *(SourceLocation *)(puVar11 + 2);
            pNVar18 = (NetAliasSymbol *)puVar11[3];
            SVar25 = *(SourceLocation *)&dst->options;
            pNStack_548 = *(NetAliasSymbol **)&(dst->options).maxCheckerInstanceDepth;
            if (bVar7) {
              pNVar5 = pNVar20;
              SVar6 = SVar12;
              if ((local_5a4 & 1) != 0) {
                pNVar18 = pNVar20;
                pNVar5 = pNStack_548;
                SVar6 = SVar25;
                SVar13 = SVar12;
              }
              SVar25 = SVar6;
              pNStack_548 = pNVar5;
              bVar7 = false;
            }
            lVar19 = (long)pNVar18 - (long)SVar13;
            lVar21 = (long)pNStack_548 - (long)SVar25;
            if (lVar19 + 1U < lVar21 + 1U) {
              pNVar20 = (NetAliasSymbol *)((long)pNStack_548 - (lVar19 + 1U));
              if (!bVar7) {
                bVar7 = true;
              }
              local_5a4 = 0;
              pCVar15 = dst;
              lVar21 = lVar19;
              puVar22 = puVar11 + 4;
              SVar12 = SVar25;
            }
            else {
              pCVar15 = (Compilation *)&(dst->options).maxConstexprDepth;
              if (lVar19 == lVar21) {
                puVar22 = puVar11 + 4;
              }
              else {
                pNVar20 = (NetAliasSymbol *)((long)pNVar18 - (lVar21 + 1U));
                if (!bVar7) {
                  bVar7 = true;
                }
                local_5a4 = 1;
                puVar22 = puVar11;
                SVar12 = SVar13;
              }
            }
            firstRange.first = (long)pNVar18 - lVar21;
            local_550 = (long)pNStack_548 - lVar21;
            secondRange.second = (unsigned_long)pNStack_548;
            secondRange.first = local_550;
            firstRange.second = (unsigned_long)pNVar18;
            Compilation::noteNetAlias
                      (local_560,local_598,(Symbol *)*puVar11,firstRange,(Expression *)puVar11[1],
                       (Symbol *)(dst->super_BumpAllocator).head,secondRange,
                       (Expression *)(dst->super_BumpAllocator).endPtr);
            puVar11 = puVar22;
            dst = pCVar15;
          }
          uVar14 = local_568 + 1;
        } while (uVar14 < local_588);
      } while (local_578 != local_580);
    }
    ppEVar23 = (local_590->netRefs).
               super__Optional_base<std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>,_true,_true>
               ._M_payload.
               super__Optional_payload_base<std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
               ._M_payload._M_value._M_ptr;
    _Var16._M_extent_value =
         (local_590->netRefs).
         super__Optional_base<std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>,_true,_true>
         ._M_payload.
         super__Optional_payload_base<std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
         ._M_payload._M_value._M_extent._M_extent_value;
    SmallVectorBase<slang::SmallVector<slang::ast::NetAlias,_2UL>_>::cleanup
              (&local_450,(EVP_PKEY_CTX *)dst);
    if (local_500.netAliases.super_SmallVectorBase<slang::ast::NetAlias>.data_ !=
        (pointer)local_500.netAliases.super_SmallVectorBase<slang::ast::NetAlias>.firstElement) {
      operator_delete(local_500.netAliases.super_SmallVectorBase<slang::ast::NetAlias>.data_);
    }
    SmallVectorBase<slang::Diagnostic>::cleanup
              ((SmallVectorBase<slang::Diagnostic> *)&local_388.warnings,(EVP_PKEY_CTX *)dst);
    SmallVectorBase<slang::Diagnostic>::cleanup
              ((SmallVectorBase<slang::Diagnostic> *)&local_388.diags,(EVP_PKEY_CTX *)dst);
    if (local_388.lvalStack.super_SmallVectorBase<slang::ast::LValue_*>.data_ !=
        (pointer)local_388.lvalStack.super_SmallVectorBase<slang::ast::LValue_*>.firstElement) {
      operator_delete(local_388.lvalStack.super_SmallVectorBase<slang::ast::LValue_*>.data_);
    }
    SmallVectorBase<slang::ast::EvalContext::Frame>::cleanup
              (&local_388.stack.super_SmallVectorBase<slang::ast::EvalContext::Frame>,
               (EVP_PKEY_CTX *)dst);
    if (local_540[0].data_ != (pointer)local_540[0].firstElement) {
      operator_delete(local_540[0].data_);
    }
  }
  sVar27._M_extent._M_extent_value = _Var16._M_extent_value;
  sVar27._M_ptr = ppEVar23;
  return sVar27;
}

Assistant:

std::span<const Expression* const> NetAliasSymbol::getNetReferences() const {
    if (netRefs)
        return *netRefs;

    auto scope = getParentScope();
    auto syntax = getSyntax();
    SLANG_ASSERT(scope && syntax);

    SmallVector<const Expression*> buffer;
    ASTContext context(*scope, LookupLocation::after(*this),
                       ASTFlags::NonProcedural | ASTFlags::NotADriver);
    EvalContext evalCtx(context);
    NetAliasVisitor visitor(context, evalCtx);
    SmallVector<SmallVector<NetAlias>> netAliases;
    bitwidth_t bitWidth = 0;
    bool issuedError = false;

    for (auto exprSyntax : syntax->as<NetAliasSyntax>().nets) {
        auto& netRef = Expression::bind(*exprSyntax, context);
        if (!netRef.requireLValue(context))
            continue;

        if (!bitWidth) {
            bitWidth = netRef.type->getBitWidth();
        }
        else if (bitWidth != netRef.type->getBitWidth() && !issuedError) {
            auto& diag = context.addDiag(diag::NetAliasWidthMismatch, netRef.sourceRange);
            diag << netRef.type->getBitWidth() << bitWidth;
            issuedError = true;
        }

        netRef.visit(visitor);
        buffer.push_back(&netRef);
        if (!visitor.netAliases.empty()) {
            netAliases.emplace_back(std::move(visitor.netAliases));
            visitor.netAliases.clear();
        }
    }

    netRefs = buffer.copy(scope->getCompilation());
    if (issuedError || netAliases.empty())
        return *netRefs;

    // Compare every net alias expression to every other, finding the set of
    // bits that overlap and adding drivers for them so that we can catch
    // and report on duplicate and/or self aliases.
    auto& comp = scope->getCompilation();
    const size_t numAliases = netAliases.size();
    for (size_t i = 0; i < numAliases - 1; i++) {
        for (size_t j = i + 1; j < numAliases; j++) {
            auto& first = netAliases[i];
            auto& second = netAliases[j];
            auto firstIt = first.begin();
            auto firstEnd = first.end();
            auto secondIt = second.begin();
            auto secondEnd = second.end();

            // Compare each net reference or selection from the left hand side
            // to the corresponding elements on the right hand side. The individual
            // elements can differ in width, so consume bits from the larger side
            // and only advance when a side has been consumed.
            std::optional<std::pair<DriverBitRange, bool>> remainder;
            while (firstIt != firstEnd && secondIt != secondEnd) {
                auto& firstAlias = *firstIt;
                auto& secondAlias = *secondIt;
                auto firstRange = firstAlias.bounds;
                auto secondRange = secondAlias.bounds;

                if (remainder) {
                    if (remainder->second)
                        firstRange = remainder->first;
                    else
                        secondRange = remainder->first;
                    remainder.reset();
                }

                auto firstWidth = firstRange.second - firstRange.first + 1;
                auto secondWidth = secondRange.second - secondRange.first + 1;

                uint64_t width;
                if (firstWidth < secondWidth) {
                    width = firstWidth;
                    remainder = std::pair(
                        DriverBitRange(secondRange.first, secondRange.second - width), false);
                    firstIt++;
                }
                else {
                    width = secondWidth;
                    secondIt++;

                    if (firstWidth == secondWidth)
                        firstIt++;
                    else {
                        remainder = std::pair(
                            DriverBitRange(firstRange.first, firstRange.second - width), true);
                    }
                }

                comp.noteNetAlias(*scope, *firstAlias.sym,
                                  {firstRange.second - width + 1, firstRange.second},
                                  *firstAlias.expr, *secondAlias.sym,
                                  {secondRange.second - width + 1, secondRange.second},
                                  *secondAlias.expr);
            }
        }
    }

    return *netRefs;
}